

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileMtlImporter::getTextureOption
          (ObjFileMtlImporter *this,bool *clamp,int *clampIndex,aiString **out)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  char value_1 [3];
  char value [12];
  byte local_5b [3];
  bool *local_58;
  int *local_50;
  aiString **local_48;
  byte local_3c [12];
  
  pbVar8 = (byte *)(this->m_DataIt)._M_current;
  pbVar6 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar7 = pbVar6 + -1;
  bVar2 = pbVar7 == pbVar8 || pbVar8 == pbVar6;
  if (pbVar7 != pbVar8 && pbVar8 != pbVar6) {
    do {
      if (((ulong)*pbVar8 < 0x21) && ((0x100003601U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) {
        if (!bVar2) goto LAB_0073e6b6;
        break;
      }
      pbVar8 = pbVar8 + 1;
      bVar2 = pbVar8 == pbVar7 || pbVar8 == pbVar6;
    } while (pbVar8 != pbVar7 && pbVar8 != pbVar6);
  }
  goto LAB_0073e6d1;
  while (pbVar8 != pbVar7) {
LAB_0073e6b6:
    if (((*pbVar8 != 0x20) && (*pbVar8 != 9)) || (pbVar8 = pbVar8 + 1, pbVar8 == pbVar6)) break;
  }
LAB_0073e6d1:
  (this->m_DataIt)._M_current = (char *)pbVar8;
  pbVar6 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar7 = pbVar6 + -1;
  if (pbVar7 == pbVar8 || pbVar8 == pbVar6) {
    return;
  }
  local_58 = clamp;
  local_50 = clampIndex;
  local_48 = out;
LAB_0073e70d:
  if (*pbVar8 != 0x2d) {
    return;
  }
  if (ClampOption_abi_cxx11_ == (char *)0x0) {
LAB_0073ec7b:
    __assert_fail("__null != s2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                  ,0xbb,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
  }
  if (((ulong)DAT_009e3348 == 0) ||
     (iVar3 = strncasecmp((char *)pbVar8,ClampOption_abi_cxx11_,(ulong)DAT_009e3348), iVar3 == 0)) {
    bVar2 = false;
    do {
      if (((ulong)*pbVar8 < 0x21) && ((0x100003601U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) {
        if (!bVar2) goto LAB_0073e977;
        break;
      }
      pbVar8 = pbVar8 + 1;
      bVar2 = pbVar8 == pbVar7 || pbVar8 == pbVar6;
    } while (pbVar8 != pbVar7 && pbVar8 != pbVar6);
    goto LAB_0073e992;
  }
  if (TypeOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
  if (((ulong)DAT_009e33a8 == 0) ||
     (iVar3 = strncasecmp((char *)pbVar8,TypeOption_abi_cxx11_,(ulong)DAT_009e33a8), iVar3 == 0)) {
    bVar2 = false;
    do {
      if (((ulong)*pbVar8 < 0x21) && ((0x100003601U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) {
        if (!bVar2) goto LAB_0073ea4b;
        break;
      }
      pbVar8 = pbVar8 + 1;
      bVar2 = pbVar8 == pbVar7 || pbVar8 == pbVar6;
    } while (pbVar8 != pbVar7 && pbVar8 != pbVar6);
    goto LAB_0073ea66;
  }
  if (BlendUOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
  iVar3 = 2;
  if (((ulong)DAT_009e3248 != 0) &&
     (iVar4 = strncasecmp((char *)pbVar8,BlendUOption_abi_cxx11_,(ulong)DAT_009e3248), iVar4 != 0))
  {
    if (BlendVOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
    if (((ulong)DAT_009e3268 != 0) &&
       (iVar4 = strncasecmp((char *)pbVar8,BlendVOption_abi_cxx11_,(ulong)DAT_009e3268), iVar4 != 0)
       ) {
      if (BoostOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
      if (((ulong)DAT_009e3288 != 0) &&
         (iVar4 = strncasecmp((char *)pbVar8,BoostOption_abi_cxx11_,(ulong)DAT_009e3288), iVar4 != 0
         )) {
        if (ResolutionOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
        if (((ulong)DAT_009e3328 != 0) &&
           (iVar4 = strncasecmp((char *)pbVar8,ResolutionOption_abi_cxx11_,(ulong)DAT_009e3328),
           iVar4 != 0)) {
          if (BumpOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
          if (((ulong)DAT_009e3368 != 0) &&
             (iVar4 = strncasecmp((char *)pbVar8,BumpOption_abi_cxx11_,(ulong)DAT_009e3368),
             iVar4 != 0)) {
            if (ChannelOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
            if (((ulong)DAT_009e3388 != 0) &&
               (iVar4 = strncasecmp((char *)pbVar8,ChannelOption_abi_cxx11_,(ulong)DAT_009e3388),
               iVar4 != 0)) {
              if (ModifyMapOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
              iVar3 = 3;
              if (((ulong)DAT_009e32a8 != 0) &&
                 (iVar4 = strncasecmp((char *)pbVar8,ModifyMapOption_abi_cxx11_,(ulong)DAT_009e32a8)
                 , iVar4 != 0)) {
                if (OffsetOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
                if (((ulong)DAT_009e32c8 != 0) &&
                   (iVar3 = strncasecmp((char *)pbVar8,OffsetOption_abi_cxx11_,(ulong)DAT_009e32c8),
                   iVar3 != 0)) {
                  if (ScaleOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
                  if (((ulong)DAT_009e32e8 != 0) &&
                     (iVar3 = strncasecmp((char *)pbVar8,ScaleOption_abi_cxx11_,(ulong)DAT_009e32e8)
                     , iVar3 != 0)) {
                    if (TurbulenceOption_abi_cxx11_ == (char *)0x0) goto LAB_0073ec7b;
                    if ((ulong)DAT_009e3308 != 0) {
                      iVar4 = strncasecmp((char *)pbVar8,TurbulenceOption_abi_cxx11_,
                                          (ulong)DAT_009e3308);
                      iVar3 = 1;
                      if (iVar4 != 0) goto LAB_0073ebe9;
                    }
                  }
                }
                iVar3 = 4;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0073ebe9;
  while (pbVar8 != pbVar7) {
LAB_0073e977:
    if (((*pbVar8 != 0x20) && (*pbVar8 != 9)) || (pbVar8 = pbVar8 + 1, pbVar8 == pbVar6)) break;
  }
LAB_0073e992:
  if (pbVar7 != pbVar8 && pbVar8 != pbVar6) {
    while ((*pbVar8 == 0x20 || (*pbVar8 == 9))) {
      pbVar8 = pbVar8 + 1;
      if ((pbVar8 == pbVar6) || (pbVar8 == pbVar7)) break;
    }
  }
  lVar5 = 0;
  do {
    bVar1 = pbVar8[lVar5];
    if ((((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((pbVar8 + lVar5 == pbVar6 || (pbVar8 + lVar5 == pbVar7)))) goto LAB_0073e9f0;
    local_5b[lVar5] = bVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  lVar5 = 2;
LAB_0073e9f0:
  local_5b[lVar5] = 0;
  iVar3 = strncasecmp((char *)local_5b,"on",2);
  if (iVar3 == 0) {
    *local_58 = true;
  }
LAB_0073ebe4:
  iVar3 = 2;
LAB_0073ebe9:
  pbVar6 = (byte *)(this->m_DataIt)._M_current;
  pbVar8 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar7 = pbVar8 + -1;
  iVar4 = 0;
LAB_0073ec03:
  do {
    if (pbVar7 != pbVar6 && pbVar6 != pbVar8) {
      if ((0x20 < (ulong)*pbVar6) || ((0x100003601U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) {
        pbVar6 = pbVar6 + 1;
        goto LAB_0073ec03;
      }
      if (pbVar7 != pbVar6 && pbVar6 != pbVar8) {
        do {
          if (((*pbVar6 != 0x20) && (*pbVar6 != 9)) || (pbVar6 = pbVar6 + 1, pbVar6 == pbVar8))
          break;
        } while (pbVar6 != pbVar7);
      }
    }
    (this->m_DataIt)._M_current = (char *)pbVar6;
    iVar4 = iVar4 + 1;
  } while (iVar4 != iVar3);
  pbVar8 = (byte *)(this->m_DataIt)._M_current;
  pbVar6 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar8 == pbVar6) {
    return;
  }
  pbVar7 = pbVar6 + -1;
  if (pbVar7 == pbVar8) {
    return;
  }
  goto LAB_0073e70d;
  while (pbVar8 != pbVar7) {
LAB_0073ea4b:
    if (((*pbVar8 != 0x20) && (*pbVar8 != 9)) || (pbVar8 = pbVar8 + 1, pbVar8 == pbVar6)) break;
  }
LAB_0073ea66:
  if (pbVar7 != pbVar8 && pbVar8 != pbVar6) {
    while ((*pbVar8 == 0x20 || (*pbVar8 == 9))) {
      pbVar8 = pbVar8 + 1;
      if ((pbVar8 == pbVar6) || (pbVar8 == pbVar7)) break;
    }
  }
  lVar5 = 0;
  do {
    bVar1 = pbVar8[lVar5];
    if ((((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((pbVar8 + lVar5 == pbVar6 || (pbVar8 + lVar5 == pbVar7)))) goto LAB_0073eac4;
    local_3c[lVar5] = bVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  lVar5 = 0xb;
LAB_0073eac4:
  local_3c[lVar5] = 0;
  iVar3 = strncasecmp((char *)local_3c,"cube_top",8);
  lVar5 = 0x1c1c;
  if (iVar3 == 0) {
    iVar3 = 7;
  }
  else {
    iVar3 = strncasecmp((char *)local_3c,"cube_bottom",0xb);
    if (iVar3 == 0) {
      lVar5 = 0x2020;
      iVar3 = 8;
    }
    else {
      iVar3 = strncasecmp((char *)local_3c,"cube_front",10);
      if (iVar3 == 0) {
        lVar5 = 0x2424;
        iVar3 = 9;
      }
      else {
        iVar3 = strncasecmp((char *)local_3c,"cube_back",9);
        if (iVar3 == 0) {
          lVar5 = 0x2828;
          iVar3 = 10;
        }
        else {
          iVar3 = strncasecmp((char *)local_3c,"cube_left",9);
          if (iVar3 == 0) {
            lVar5 = 0x2c2c;
            iVar3 = 0xb;
          }
          else {
            iVar3 = strncasecmp((char *)local_3c,"cube_right",10);
            if (iVar3 == 0) {
              lVar5 = 0x3030;
              iVar3 = 0xc;
            }
            else {
              iVar3 = strncasecmp((char *)local_3c,"sphere",6);
              if (iVar3 != 0) goto LAB_0073ebe4;
              iVar3 = 6;
            }
          }
        }
      }
    }
  }
  *local_50 = iVar3;
  *local_48 = (aiString *)((this->m_pModel->m_pCurrentMaterial->MaterialName).data + lVar5 + -4);
  goto LAB_0073ebe4;
}

Assistant:

void ObjFileMtlImporter::getTextureOption(bool &clamp, int &clampIndex, aiString *&out) {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);

    // If there is any more texture option
    while (!isEndOfBuffer(m_DataIt, m_DataItEnd) && *m_DataIt == '-')
    {
        const char *pPtr( &(*m_DataIt) );
        //skip option key and value
        int skipToken = 1;

        if (!ASSIMP_strincmp(pPtr, ClampOption.c_str(), static_cast<unsigned int>(ClampOption.size())))
        {
            DataArrayIt it = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
            char value[3];
            CopyNextWord(it, m_DataItEnd, value, sizeof(value) / sizeof(*value));
            if (!ASSIMP_strincmp(value, "on", 2))
            {
                clamp = true;
            }

            skipToken = 2;
        }
        else if( !ASSIMP_strincmp( pPtr, TypeOption.c_str(), static_cast<unsigned int>(TypeOption.size()) ) )
        {
            DataArrayIt it = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
            char value[ 12 ];
            CopyNextWord( it, m_DataItEnd, value, sizeof( value ) / sizeof( *value ) );
            if( !ASSIMP_strincmp( value, "cube_top", 8 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeTopType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }
            else if( !ASSIMP_strincmp( value, "cube_bottom", 11 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBottomType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[1];
            }
            else if( !ASSIMP_strincmp( value, "cube_front", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeFrontType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[2];
            }
            else if( !ASSIMP_strincmp( value, "cube_back", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBackType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[3];
            }
            else if( !ASSIMP_strincmp( value, "cube_left", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeLeftType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[4];
            }
            else if( !ASSIMP_strincmp( value, "cube_right", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeRightType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[5];
            }
            else if( !ASSIMP_strincmp( value, "sphere", 6 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionSphereType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }

            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, BlendUOption.c_str(), static_cast<unsigned int>(BlendUOption.size()))
                || !ASSIMP_strincmp(pPtr, BlendVOption.c_str(), static_cast<unsigned int>(BlendVOption.size()))
                || !ASSIMP_strincmp(pPtr, BoostOption.c_str(), static_cast<unsigned int>(BoostOption.size()))
                || !ASSIMP_strincmp(pPtr, ResolutionOption.c_str(), static_cast<unsigned int>(ResolutionOption.size()))
                || !ASSIMP_strincmp(pPtr, BumpOption.c_str(), static_cast<unsigned int>(BumpOption.size()))
                || !ASSIMP_strincmp(pPtr, ChannelOption.c_str(), static_cast<unsigned int>(ChannelOption.size())))
        {
            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, ModifyMapOption.c_str(), static_cast<unsigned int>(ModifyMapOption.size())))
        {
            skipToken = 3;
        }
        else if (  !ASSIMP_strincmp(pPtr, OffsetOption.c_str(), static_cast<unsigned int>(OffsetOption.size()))
                || !ASSIMP_strincmp(pPtr, ScaleOption.c_str(), static_cast<unsigned int>(ScaleOption.size()))
                || !ASSIMP_strincmp(pPtr, TurbulenceOption.c_str(), static_cast<unsigned int>(TurbulenceOption.size()))
                )
        {
            skipToken = 4;
        }

        for (int i = 0; i < skipToken; ++i)
        {
            m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
        }
    }
}